

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_15uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  byte bVar15;
  ulong uVar16;
  uint uVar17;
  int needed;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  byte *pbVar21;
  byte *pbVar22;
  
  if ((length & 0xfffffffffffffff8) == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      bVar1 = pSrc[1];
      bVar15 = pSrc[2];
      bVar2 = pSrc[3];
      bVar3 = pSrc[4];
      bVar4 = pSrc[5];
      bVar5 = pSrc[6];
      bVar6 = pSrc[7];
      bVar7 = pSrc[8];
      bVar8 = pSrc[9];
      bVar9 = pSrc[10];
      bVar10 = pSrc[0xb];
      bVar11 = pSrc[0xc];
      bVar12 = pSrc[0xd];
      bVar13 = pSrc[0xe];
      pDst[uVar16] = (uint)(bVar1 >> 1) | (uint)*pSrc << 7;
      pDst[uVar16 + 1] = (uint)(bVar2 >> 2) | (uint)bVar15 << 6 | (bVar1 & 1) << 0xe;
      pDst[uVar16 + 2] = (uint)(bVar4 >> 3) | (uint)bVar3 << 5 | (bVar2 & 3) << 0xd;
      pDst[uVar16 + 3] = (uint)(bVar6 >> 4) | (uint)bVar5 << 4 | (bVar4 & 7) << 0xc;
      pDst[uVar16 + 4] = (uint)(bVar8 >> 5) | (bVar6 & 0xf) * 0x800 + (uint)bVar7 * 8;
      pDst[uVar16 + 5] = (uint)(bVar10 >> 6) | (bVar8 & 0x1f) * 0x400 + (uint)bVar9 * 4;
      pDst[uVar16 + 6] = (uint)(bVar12 >> 7) | (bVar10 & 0x3f) * 0x200 + (uint)bVar11 * 2;
      pDst[uVar16 + 7] = (bVar12 & 0x7f) << 8 | (uint)bVar13;
      pSrc = pSrc + 0xf;
      uVar16 = uVar16 + 8;
    } while (uVar16 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar19 = (uint)pSrc[1];
    pDst[uVar16] = (uint)(pSrc[1] >> 1) | (uint)*pSrc << 7;
    uVar17 = (uint)(length & 7);
    if (uVar17 != 1) {
      iVar14 = 1;
      uVar18 = 0xf;
      uVar20 = 0;
      pbVar21 = pSrc + 2;
      do {
        pbVar22 = pbVar21;
        uVar18 = uVar18 - iVar14;
        bVar1 = (byte)uVar18 & 0x1f;
        uVar20 = (uVar20 | ~(-1 << (sbyte)iVar14) & uVar19) << bVar1;
        uVar19 = (uint)*pbVar22;
        pbVar21 = pbVar22 + 1;
        iVar14 = 8;
      } while (8 < uVar18);
      iVar14 = 8 - uVar18;
      pDst[uVar16 + 1] =
           ~(-1 << ((byte)uVar18 & 0x1f)) & (uint)(*pbVar22 >> ((byte)iVar14 & 0x1f)) | uVar20;
      if (2 < uVar17) {
        if (uVar18 == 8) {
          uVar19 = (uint)*pbVar21;
          pbVar21 = pbVar22 + 2;
          iVar14 = 8;
        }
        uVar18 = 0xf;
        uVar20 = 0 << bVar1;
        do {
          pbVar22 = pbVar21;
          uVar18 = uVar18 - iVar14;
          bVar1 = (byte)uVar18 & 0x1f;
          uVar20 = (uVar20 | ~(-1 << ((byte)iVar14 & 0x1f)) & uVar19) << bVar1;
          uVar19 = (uint)*pbVar22;
          pbVar21 = pbVar22 + 1;
          iVar14 = 8;
        } while (8 < uVar18);
        iVar14 = 8 - uVar18;
        pDst[uVar16 + 2] =
             ~(-1 << ((byte)uVar18 & 0x1f)) & (uint)(*pbVar22 >> ((byte)iVar14 & 0x1f)) | uVar20;
        if (uVar17 != 3) {
          if (uVar18 == 8) {
            uVar19 = (uint)*pbVar21;
            pbVar21 = pbVar22 + 2;
            iVar14 = 8;
          }
          uVar18 = 0xf;
          uVar20 = 0 << bVar1;
          do {
            pbVar22 = pbVar21;
            uVar18 = uVar18 - iVar14;
            bVar1 = (byte)uVar18 & 0x1f;
            uVar20 = (uVar20 | ~(-1 << ((byte)iVar14 & 0x1f)) & uVar19) << bVar1;
            uVar19 = (uint)*pbVar22;
            pbVar21 = pbVar22 + 1;
            iVar14 = 8;
          } while (8 < uVar18);
          iVar14 = 8 - uVar18;
          pDst[uVar16 + 3] =
               ~(-1 << ((byte)uVar18 & 0x1f)) & (uint)(*pbVar22 >> ((byte)iVar14 & 0x1f)) | uVar20;
          if (4 < uVar17) {
            if (uVar18 == 8) {
              uVar19 = (uint)*pbVar21;
              pbVar21 = pbVar22 + 2;
              iVar14 = 8;
            }
            uVar18 = 0xf;
            uVar20 = 0 << bVar1;
            do {
              pbVar22 = pbVar21;
              uVar18 = uVar18 - iVar14;
              bVar1 = (byte)uVar18 & 0x1f;
              uVar20 = (uVar20 | ~(-1 << ((byte)iVar14 & 0x1f)) & uVar19) << bVar1;
              uVar19 = (uint)*pbVar22;
              pbVar21 = pbVar22 + 1;
              iVar14 = 8;
            } while (8 < uVar18);
            iVar14 = 8 - uVar18;
            pDst[uVar16 + 4] =
                 ~(-1 << ((byte)uVar18 & 0x1f)) & (uint)(*pbVar22 >> ((byte)iVar14 & 0x1f)) | uVar20
            ;
            if (uVar17 != 5) {
              if (uVar18 == 8) {
                uVar19 = (uint)*pbVar21;
                pbVar21 = pbVar22 + 2;
                iVar14 = 8;
              }
              uVar18 = 0xf;
              uVar20 = 0 << bVar1;
              do {
                pbVar22 = pbVar21;
                uVar18 = uVar18 - iVar14;
                uVar20 = (uVar20 | ~(-1 << ((byte)iVar14 & 0x1f)) & uVar19) << ((byte)uVar18 & 0x1f)
                ;
                uVar19 = (uint)*pbVar22;
                pbVar21 = pbVar22 + 1;
                iVar14 = 8;
              } while (8 < uVar18);
              iVar14 = 8 - uVar18;
              pDst[uVar16 + 5] =
                   ~(-1 << ((byte)uVar18 & 0x1f)) & (uint)(*pbVar22 >> ((byte)iVar14 & 0x1f)) |
                   uVar20;
              if (uVar17 == 7) {
                if (uVar18 == 8) {
                  uVar19 = (uint)*pbVar21;
                  pbVar21 = pbVar22 + 2;
                  iVar14 = 8;
                }
                uVar17 = 0xf;
                uVar18 = 0;
                do {
                  uVar17 = uVar17 - iVar14;
                  bVar15 = (byte)uVar17;
                  uVar18 = (uVar18 | ~(-1 << ((byte)iVar14 & 0x1f)) & uVar19) << (bVar15 & 0x1f);
                  bVar1 = *pbVar21;
                  uVar19 = (uint)bVar1;
                  pbVar21 = pbVar21 + 1;
                  iVar14 = 8;
                } while (8 < uVar17);
                pDst[uVar16 + 6] =
                     ~(-1 << (bVar15 & 0x1f)) & (uint)(bVar1 >> (8 - bVar15 & 0x1f)) | uVar18;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_15uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;
        OPJ_UINT32 val11 = *pSrc++;
        OPJ_UINT32 val12 = *pSrc++;
        OPJ_UINT32 val13 = *pSrc++;
        OPJ_UINT32 val14 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 7) | (val1 >> 1));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x1U) << 14) | (val2 << 6) | (val3 >> 2));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0x3U) << 13) | (val4 << 5) | (val5 >> 3));
        pDst[i + 3] = (OPJ_INT32)(((val5 & 0x7U) << 12) | (val6 << 4) | (val7 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val7 & 0xFU) << 11) | (val8 << 3) | (val9 >> 5));
        pDst[i + 5] = (OPJ_INT32)(((val9 & 0x1FU) << 10) | (val10 << 2) | (val11 >> 6));
        pDst[i + 6] = (OPJ_INT32)(((val11 & 0x3FU) << 9) | (val12 << 1) | (val13 >> 7));
        pDst[i + 7] = (OPJ_INT32)(((val13 & 0x7FU) << 8) | (val14));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 15)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 15)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 15)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 15)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 15)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 15)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 15)
                            }
                        }
                    }
                }
            }
        }
    }
}